

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O3

int __thiscall
cmCommandArgumentParserHelper::LexInput(cmCommandArgumentParserHelper *this,char *buf,int maxlen)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  
  iVar3 = 0;
  if (0 < maxlen) {
    uVar2 = this->InputBufferPos;
    if (uVar2 < (this->InputBuffer)._M_string_length) {
      this->InputBufferPos = uVar2 + 1;
      cVar1 = (this->InputBuffer)._M_dataplus._M_p[uVar2];
      *buf = cVar1;
      iVar3 = 1;
      if (cVar1 == '\n') {
        this->CurrentLine = this->CurrentLine + 1;
        return 1;
      }
    }
    else {
      *buf = '\n';
    }
  }
  return iVar3;
}

Assistant:

int cmCommandArgumentParserHelper::LexInput(char* buf, int maxlen)
{
  if ( maxlen < 1 )
    {
    return 0;
    }
  if ( this->InputBufferPos < this->InputBuffer.size() )
    {
    buf[0] = this->InputBuffer[ this->InputBufferPos++ ];
    if ( buf[0] == '\n' )
      {
      this->CurrentLine ++;
      }
    return(1);
    }
  else
    {
    buf[0] = '\n';
    return( 0 );
    }
}